

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expreplay.h
# Opt level: O3

void ExpReplay::finish<COST_SENSITIVE::cs_label>(expreplay *er)

{
  ulong uVar1;
  long lVar2;
  
  if (er->N != 0) {
    lVar2 = 0;
    uVar1 = 0;
    do {
      (*(code *)PTR_delete_label_002dea78)();
      VW::dealloc_example((_func_void_void_ptr *)0x0,
                          (example *)
                          ((long)(er->buf->super_example_predict).feature_space + lVar2 + -0x20),
                          (_func_void_void_ptr *)0x0);
      uVar1 = uVar1 + 1;
      lVar2 = lVar2 + 0x68d0;
    } while (uVar1 < er->N);
  }
  free(er->buf);
  free(er->filled);
  return;
}

Assistant:

void finish(expreplay& er)
{
  for (size_t n = 0; n < er.N; n++)
  {
    lp.delete_label(&er.buf[n].l);
    VW::dealloc_example(NULL, er.buf[n], NULL);  // TODO: need to free label
  }
  free(er.buf);
  free(er.filled);
}